

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::
_preBegin__profile_GLSL__technique__pass__states__stencil_func_separate__front
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  ParserChar *additionalText;
  long lVar1;
  bool bVar2;
  profile_GLSL__technique__pass__states__stencil_func_separate__front__AttributeData *ppVar3;
  undefined *puVar4;
  StringHash SVar5;
  long lVar6;
  xmlChar **ppxVar7;
  bool bVar8;
  bool local_39;
  ParserTemplateBase *local_38;
  
  local_38 = (ParserTemplateBase *)this;
  ppVar3 = GeneratedSaxParser::ParserTemplateBase::
           newData<COLLADASaxFWL15::profile_GLSL__technique__pass__states__stencil_func_separate__front__AttributeData>
                     ((ParserTemplateBase *)this,attributeDataPtr);
  ppxVar7 = attributes->attributes;
  if (ppxVar7 == (xmlChar **)0x0) {
    return true;
  }
LAB_00756932:
  do {
    while( true ) {
      while( true ) {
        text = *ppxVar7;
        bVar8 = text == (ParserChar *)0x0;
        if (bVar8) {
          return bVar8;
        }
        puVar4 = (undefined *)GeneratedSaxParser::Utils::calculateStringHash(text);
        additionalText = ppxVar7[1];
        ppxVar7 = ppxVar7 + 2;
        if (puVar4 != (undefined *)0x76887d) break;
        ppVar3->param = additionalText;
      }
      if (puVar4 == &DAT_007c83b5) break;
      bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                        (local_38,SEVERITY_ERROR_NONCRITICAL,ERROR_UNKNOWN_ATTRIBUTE,0x6d9654,text,
                         additionalText);
      if (bVar2) {
        return bVar8;
      }
    }
    SVar5 = GeneratedSaxParser::Utils::calculateStringHash(additionalText,&local_39);
    lVar1 = 0;
    do {
      lVar6 = lVar1;
      if (lVar6 + 0x10 == 0x90) {
        local_39 = true;
        ppVar3->value = ENUM__gl_func_enum__COUNT;
        bVar8 = GeneratedSaxParser::ParserTemplateBase::handleError
                          (local_38,SEVERITY_ERROR_NONCRITICAL,ERROR_ATTRIBUTE_PARSING_FAILED,
                           0x6d9654,0x7c83b5,additionalText);
        if (bVar8) {
          return false;
        }
        goto LAB_00756932;
      }
      lVar1 = lVar6 + 0x10;
    } while (*(StringHash *)((long)&ENUM__gl_func_enumMap + lVar6) != SVar5);
    ppVar3->value = *(ENUM__gl_func_enum *)((long)&DAT_00868c98 + lVar6);
  } while( true );
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__profile_GLSL__technique__pass__states__stencil_func_separate__front( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__profile_GLSL__technique__pass__states__stencil_func_separate__front( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

profile_GLSL__technique__pass__states__stencil_func_separate__front__AttributeData* attributeData = newData<profile_GLSL__technique__pass__states__stencil_func_separate__front__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_VALUE:
    {
bool failed;
attributeData->value = Utils::toEnum<ENUM__gl_func_enum, StringHash, ENUM__gl_func_enum__COUNT>(attributeValue, failed, ENUM__gl_func_enumMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_FRONT,
        HASH_ATTRIBUTE_VALUE,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_PARAM:
    {

attributeData->param = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->param, strlen(attributeData->param));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_FRONT,
            HASH_ATTRIBUTE_PARAM,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_FRONT, attribute, attributeValue))
            {return false;}
    }
    }
    }
}


    return true;
}